

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

_Unwind_Reason_Code __thiscall
backward::details::Unwinder<backward::StackTraceImpl<backward::system_tag::linux_tag>::callback>::
backtrace(Unwinder<backward::StackTraceImpl<backward::system_tag::linux_tag>::callback> *this,
         _Unwind_Context *ctx)

{
  long lVar1;
  _Unwind_Reason_Code _Var2;
  long lVar3;
  int ip_before_instruction;
  int local_c;
  
  if ((this->_index < 0) || (_Var2 = _URC_END_OF_STACK, (ulong)this->_index < this->_depth)) {
    local_c = 0;
    lVar3 = _Unwind_GetIPInfo(ctx,&local_c);
    lVar1 = this->_index;
    if (-1 < lVar1) {
      (this->_f->self->super_StackTraceImplHolder)._stacktrace.
      super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data._M_start
      [lVar1] = (void *)(lVar3 - (ulong)(local_c == 0));
    }
    this->_index = lVar1 + 1;
    _Var2 = _URC_NO_REASON;
  }
  return _Var2;
}

Assistant:

_Unwind_Reason_Code backtrace(_Unwind_Context *ctx) {
    if (_index >= 0 && static_cast<size_t>(_index) >= _depth)
      return _URC_END_OF_STACK;

    int ip_before_instruction = 0;
    uintptr_t ip = _Unwind_GetIPInfo(ctx, &ip_before_instruction);

    if (!ip_before_instruction) {
      // calculating 0-1 for unsigned, looks like a possible bug to sanitiziers,
      // so let's do it explicitly:
      if (ip == 0) {
        ip = std::numeric_limits<uintptr_t>::max(); // set it to 0xffff... (as
                                                    // from casting 0-1)
      } else {
        ip -= 1; // else just normally decrement it (no overflow/underflow will
                 // happen)
      }
    }

    if (_index >= 0) { // ignore first frame.
      (*_f)(static_cast<size_t>(_index), reinterpret_cast<void *>(ip));
    }
    _index += 1;
    return _URC_NO_REASON;
  }